

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

size_t gnuplotio::
       get_range_size<gnuplotio::VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>>>
                 (VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
                  *arg)

{
  bool bVar1;
  undefined1 local_30 [8];
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
  i;
  size_t ret;
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
  *arg_local;
  
  i.rvec.
  super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
  ::VecOfRange((VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
                *)local_30,arg);
  while( true ) {
    bVar1 = VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
            ::is_end((VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
                      *)local_30);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    i.rvec.
    super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&((i.rvec.
                            super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->it)._M_current + 1)
    ;
    VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
    ::inc((VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
           *)local_30);
  }
  VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
  ::~VecOfRange((VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
                 *)local_30);
  return (size_t)i.rvec.
                 super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
}

Assistant:

size_t get_range_size(const T &arg) {
    // FIXME - not the fastest way.  Implement a size() method for range.
    size_t ret = 0;
    for(T i=arg; !i.is_end(); i.inc()) ++ret;
    return ret;
}